

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void convert_4u32s_C1R(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (length & 0xfffffffffffffffe); uVar2 = uVar2 + 2) {
    bVar1 = *pSrc;
    pSrc = pSrc + 1;
    pDst[uVar2] = (uint)(bVar1 >> 4);
    pDst[uVar2 + 1] = bVar1 & 0xf;
  }
  if ((length & 1) != 0) {
    pDst[uVar2] = (uint)(*pSrc >> 4);
  }
  return;
}

Assistant:

static void convert_4u32s_C1R(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)1U); i+=2U) {
		OPJ_UINT32 val = *pSrc++;
		pDst[i+0] = (OPJ_INT32)(val >> 4);
		pDst[i+1] = (OPJ_INT32)(val & 0xFU);
	}
	if (length & 1U) {
		OPJ_UINT8 val = *pSrc++;
		pDst[i+0] = (OPJ_INT32)(val >> 4);
	}
}